

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

double asl::log(double __x)

{
  int n;
  char in_AL;
  Log *this;
  char *in_RDX;
  int iVar1;
  undefined8 __s;
  int iVar2;
  bool bVar3;
  double __x_00;
  double extraout_XMM0_Qa;
  String message;
  va_list arg;
  undefined1 local_e8 [48];
  double local_b8;
  
  if (in_AL != '\0') {
    local_b8 = __x;
  }
  String::String(&message,100,0);
  iVar2 = message._size;
  if (message._size == 0) {
    iVar2 = 0x10;
  }
  iVar1 = 9;
  while( true ) {
    arg[0].reg_save_area = local_e8;
    arg[0].overflow_arg_area = &stack0x00000008;
    arg[0].gp_offset = 0x18;
    arg[0].fp_offset = 0x30;
    __s = &message.field_2;
    if (message._size != 0) {
      __s = message.field_2._str;
    }
    message._len = vsnprintf((char *)__s,(long)iVar2,in_RDX,arg);
    if (((message._len != -1) && (message._len < iVar2)) ||
       (bVar3 = iVar1 == 0, iVar1 = iVar1 + -1, bVar3)) break;
    n = iVar2 * 2;
    if (iVar2 <= message._len) {
      n = message._len;
    }
    String::resize(&message,n,false,true);
    iVar2 = message._size;
    if (message._size == 0) {
      iVar2 = 0x10;
    }
  }
  this = Singleton<asl::Log>::instance();
  Log::log(this,__x_00);
  String::~String(&message);
  return extraout_XMM0_Qa;
}

Assistant:

void log(const String& cat, Log::Level level, ASL_PRINTF_W1 const char* fmt, ...)
{
	String message(100, 0);
	va_list arg;
	va_start(arg, fmt);
	int i = 0, n = 0;
	int space = message.cap();
	while (((n = vsnprintf(message.data(), space, fmt, arg)) == -1 || n >= space) && ++i < 10)
	{
		message.resize((n >= space) ? n : 2 * space, false);
		space = message.cap();
		va_end(arg);
		va_start(arg, fmt);
	}
	va_end(arg);
	message.fix(n);

	Log::instance()->log(cat, level, message);
}